

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

Vec_Ptr_t * Ssw_SmlSimDataPointers(Ssw_Sml_t *p)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  void **__s;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  
  iVar1 = p->pAig->vObjs->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar4 << 3);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  memset(__s,0,(long)iVar1 * 8);
  pAVar2 = p->pAig;
  pVVar6 = pAVar2->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      if (pVVar6->pArray[lVar5] != (void *)0x0) {
        if (iVar1 <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[lVar5] = (void *)((long)&p[1].pAig + (long)(int)lVar5 * (long)p->nWordsTotal * 4);
      }
      lVar5 = lVar5 + 1;
      pVVar6 = pAVar2->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Ssw_SmlSimDataPointers( Ssw_Sml_t * p )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i;
    vSimInfo = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
        Vec_PtrWriteEntry( vSimInfo, i, Ssw_ObjSim(p, i) );
    return vSimInfo;
}